

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::printCurrentTestStarted(JUnitTestOutput *this,UtestShell *test)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  UtestShell *in_RSI;
  JUnitTestCaseResultNode *in_RDI;
  UtestShell *in_stack_ffffffffffffff78;
  SimpleString *in_stack_ffffffffffffff80;
  SimpleString *this_00;
  SimpleString local_50 [4];
  UtestShell *local_10;
  
  **(long **)&in_RDI->ignored_ = **(long **)&in_RDI->ignored_ + 1;
  local_10 = in_RSI;
  UtestShell::getGroup(in_stack_ffffffffffffff78);
  SimpleString::operator=(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78);
  SimpleString::~SimpleString((SimpleString *)0x176d55);
  lVar2 = (*GetPlatformSpecificTimeInMillis)();
  *(long *)(*(long *)&in_RDI->ignored_ + 0x18) = lVar2;
  if (*(long *)(*(long *)&in_RDI->ignored_ + 0x40) == 0) {
    pvVar3 = operator_new((size_t)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                          0x176d93);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(in_RDI);
    *(void **)(*(long *)&in_RDI->ignored_ + 0x40) = pvVar3;
    *(void **)(*(long *)&in_RDI->ignored_ + 0x38) = pvVar3;
  }
  else {
    pvVar3 = operator_new((size_t)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                          0x176e20);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(in_RDI);
    *(void **)(*(long *)(*(long *)&in_RDI->ignored_ + 0x40) + 0x48) = pvVar3;
    *(undefined8 *)(*(long *)&in_RDI->ignored_ + 0x40) =
         *(undefined8 *)(*(long *)(*(long *)&in_RDI->ignored_ + 0x40) + 0x48);
  }
  UtestShell::getName(in_stack_ffffffffffffff78);
  SimpleString::operator=(in_stack_ffffffffffffff80,(SimpleString *)in_stack_ffffffffffffff78);
  SimpleString::~SimpleString((SimpleString *)0x176ebe);
  this_00 = local_50;
  UtestShell::getFile(in_stack_ffffffffffffff78);
  SimpleString::operator=(this_00,(SimpleString *)in_stack_ffffffffffffff78);
  SimpleString::~SimpleString((SimpleString *)0x176ef9);
  sVar4 = UtestShell::getLineNumber(local_10);
  *(size_t *)(*(long *)(*(long *)&in_RDI->ignored_ + 0x40) + 0x38) = sVar4;
  uVar1 = (*local_10->_vptr_UtestShell[6])();
  if ((uVar1 & 1) == 0) {
    *(undefined1 *)(*(long *)(*(long *)&in_RDI->ignored_ + 0x40) + 0x20) = 1;
  }
  return;
}

Assistant:

void JUnitTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    impl_->results_.testCount_++;
    impl_->results_.group_ = test.getGroup();
    impl_->results_.startTime_ = (size_t) GetPlatformSpecificTimeInMillis();

    if (impl_->results_.tail_ == NULLPTR) {
        impl_->results_.head_ = impl_->results_.tail_
                = new JUnitTestCaseResultNode;
    }
    else {
        impl_->results_.tail_->next_ = new JUnitTestCaseResultNode;
        impl_->results_.tail_ = impl_->results_.tail_->next_;
    }
    impl_->results_.tail_->name_ = test.getName();
    impl_->results_.tail_->file_ = test.getFile();
    impl_->results_.tail_->lineNumber_ = test.getLineNumber();
    if (!test.willRun()) {
        impl_->results_.tail_->ignored_ = true;
    }
}